

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_utils.c
# Opt level: O2

char * asterism_strstr(asterism_str haystack,asterism_str needle)

{
  char *pcVar1;
  int iVar2;
  ulong __n;
  char *__s1;
  ulong uVar3;
  
  __n = needle.len;
  if (haystack.len < __n) {
    __s1 = (char *)0x0;
  }
  else {
    uVar3 = 0;
    pcVar1 = haystack.p;
    do {
      __s1 = pcVar1;
      if (haystack.len - __n < uVar3) {
        return (char *)0x0;
      }
      iVar2 = bcmp(__s1,needle.p,__n);
      uVar3 = uVar3 + 1;
      pcVar1 = __s1 + 1;
    } while (iVar2 != 0);
  }
  return __s1;
}

Assistant:

const char *asterism_strstr(const struct asterism_str haystack,
                            const struct asterism_str needle)
{
    size_t i;
    if (needle.len > haystack.len)
        return NULL;
    for (i = 0; i <= haystack.len - needle.len; i++)
    {
        if (memcmp(haystack.p + i, needle.p, needle.len) == 0)
        {
            return haystack.p + i;
        }
    }
    return NULL;
}